

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O0

Fl_Tree_Item * __thiscall Fl_Tree_Item::find_item(Fl_Tree_Item *this,char **names)

{
  int iVar1;
  char *pcVar2;
  char **local_20;
  char **names_local;
  Fl_Tree_Item *this_local;
  
  if (*names == (char *)0x0) {
    this_local = (Fl_Tree_Item *)0x0;
  }
  else {
    pcVar2 = label(this);
    local_20 = names;
    if (pcVar2 != (char *)0x0) {
      pcVar2 = label(this);
      iVar1 = strcmp(pcVar2,*names);
      if ((iVar1 == 0) && (local_20 = names + 1, *local_20 == (char *)0x0)) {
        return this;
      }
    }
    iVar1 = children(this);
    if (iVar1 == 0) {
      this_local = (Fl_Tree_Item *)0x0;
    }
    else {
      this_local = find_child_item(this,local_20);
    }
  }
  return this_local;
}

Assistant:

const Fl_Tree_Item *Fl_Tree_Item::find_item(char **names) const {
  if ( ! *names ) return(0);
  if ( label() && strcmp(label(), *names) == 0 ) {	// match self?
    ++names;						// skip self
    if ( *names == 0 ) return(this);			// end of names, found ourself
  }
  if ( children() ) {					// check children..
    return(find_child_item(names));
  }
  return(0);
}